

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTableModel.cpp
# Opt level: O2

void __thiscall BaseTableModel::reload(BaseTableModel *this)

{
  string *s;
  int local_3c;
  QArrayDataPointer<char16_t> local_38;
  
  QAbstractItemModel::beginResetModel();
  std::vector<std::pair<int,_QString>,_std::allocator<std::pair<int,_QString>_>_>::clear
            (&this->mItems);
  for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
    s = (string *)(**(code **)(*(long *)this + 0x198))(this);
    if (s != (string *)0x0) {
      QString::fromStdString((QString *)&local_38,s);
      std::vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>>::
      emplace_back<int&,QString>
                ((vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>> *)
                 &this->mItems,&local_3c,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void BaseTableModel::reload() {
    beginResetModel();

    mItems.clear();
    for (int id = 0; id < (int)trackerboy::InstrumentTable::MAX_SIZE; ++id) {
        auto str = sourceName(id);
        if (str) {
            mItems.emplace_back(id, QString::fromStdString(*str));
        }
    }

    endResetModel();
}